

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

ParsedIR * __thiscall spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Variant *other_00;
  Variant *this_00;
  pointer local_30;
  ulong local_28;
  size_t i_1;
  ParsedIR *pPStack_18;
  int i;
  ParsedIR *other_local;
  ParsedIR *this_local;
  
  if (this != other) {
    pPStack_18 = other;
    other_local = this;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->spirv,&other->spirv);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
    ::operator=(&this->meta,&pPStack_18->meta);
    for (i_1._4_4_ = 0; i_1._4_4_ < 0xe; i_1._4_4_ = i_1._4_4_ + 1) {
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
                (this->ids_for_type + i_1._4_4_,pPStack_18->ids_for_type + i_1._4_4_);
    }
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_type,&pPStack_18->ids_for_constant_or_type);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&pPStack_18->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&pPStack_18->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&pPStack_18->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&pPStack_18->block_meta);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
    ::operator=(&this->continue_block_to_loop_header,&pPStack_18->continue_block_to_loop_header);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
    ::operator=(&this->entry_points,&pPStack_18->entry_points);
    (this->default_entry_point).id = (pPStack_18->default_entry_point).id;
    (this->source).version = (pPStack_18->source).version;
    bVar1 = (pPStack_18->source).known;
    (this->source).es = (pPStack_18->source).es;
    (this->source).known = bVar1;
    (this->source).hlsl = (pPStack_18->source).hlsl;
    this->loop_iteration_depth_hard = pPStack_18->loop_iteration_depth_hard;
    this->loop_iteration_depth_soft = pPStack_18->loop_iteration_depth_soft;
    this->addressing_model = pPStack_18->addressing_model;
    this->memory_model = pPStack_18->memory_model;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&this->meta_needing_name_fixup,&pPStack_18->meta_needing_name_fixup);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>_>
    ::operator=(&this->load_type_width,&pPStack_18->load_type_width);
    SmallVector<spirv_cross::Variant,_8UL>::clear(&this->ids);
    sVar3 = VectorView<spirv_cross::Variant>::size
                      (&(pPStack_18->ids).super_VectorView<spirv_cross::Variant>);
    SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,sVar3);
    for (local_28 = 0; uVar2 = local_28,
        sVar3 = VectorView<spirv_cross::Variant>::size
                          (&(pPStack_18->ids).super_VectorView<spirv_cross::Variant>), uVar2 < sVar3
        ; local_28 = local_28 + 1) {
      local_30 = ::std::
                 unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                 ::get(&this->pool_group);
      SmallVector<spirv_cross::Variant,8ul>::emplace_back<spirv_cross::ObjectPoolGroup*>
                ((SmallVector<spirv_cross::Variant,8ul> *)&this->ids,&local_30);
      other_00 = VectorView<spirv_cross::Variant>::operator[]
                           (&(pPStack_18->ids).super_VectorView<spirv_cross::Variant>,local_28);
      this_00 = VectorView<spirv_cross::Variant>::back
                          (&(this->ids).super_VectorView<spirv_cross::Variant>);
      Variant::operator=(this_00,other_00);
    }
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(const ParsedIR &other)
{
	if (this != &other)
	{
		spirv = other.spirv;
		meta = other.meta;
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = other.ids_for_type[i];
		ids_for_constant_or_type = other.ids_for_constant_or_type;
		ids_for_constant_or_variable = other.ids_for_constant_or_variable;
		declared_capabilities = other.declared_capabilities;
		declared_extensions = other.declared_extensions;
		block_meta = other.block_meta;
		continue_block_to_loop_header = other.continue_block_to_loop_header;
		entry_points = other.entry_points;
		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;


		meta_needing_name_fixup = other.meta_needing_name_fixup;
		load_type_width = other.load_type_width;

		// Very deliberate copying of IDs. There is no default copy constructor, nor a simple default constructor.
		// Construct object first so we have the correct allocator set-up, then we can copy object into our new pool group.
		ids.clear();
		ids.reserve(other.ids.size());
		for (size_t i = 0; i < other.ids.size(); i++)
		{
			ids.emplace_back(pool_group.get());
			ids.back() = other.ids[i];
		}
	}
	return *this;
}